

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCatchExpr
          (ExprVisitorDelegate *this,TryExpr *expr,Catch *catch_)

{
  int *piVar1;
  int iVar2;
  WatWriter *pWVar3;
  Info local_68;
  
  pWVar3 = this->writer_;
  iVar2 = pWVar3->indent_;
  pWVar3->indent_ = iVar2 + -2;
  if (1 < iVar2) {
    if (((catch_->var).type_ == Index) && ((catch_->var).field_2.index_ == 0xffffffff)) {
      Opcode::GetInfo(&local_68,(Opcode *)&Opcode::CatchAll_Opcode);
      WritePuts(pWVar3,local_68.name,Newline);
    }
    else {
      Opcode::GetInfo(&local_68,(Opcode *)&Opcode::Catch_Opcode);
      WritePuts(pWVar3,local_68.name,Space);
      WriteVar(this->writer_,&catch_->var,Newline);
    }
    pWVar3 = this->writer_;
    piVar1 = &pWVar3->indent_;
    *piVar1 = *piVar1 + 2;
    (pWVar3->super_ModuleContext).label_stack_.
    super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.super__Vector_impl_data.
    _M_finish[-1].label_type = Catch;
    return (Result)Ok;
  }
  __assert_fail("indent_ >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wat-writer.cc"
                ,0xd1,"void wabt::(anonymous namespace)::WatWriter::Dedent()");
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCatchExpr(TryExpr* expr,
                                                   Catch* catch_) {
  writer_->Dedent();
  if (catch_->IsCatchAll()) {
    writer_->WritePutsNewline(Opcode::CatchAll_Opcode.GetName());
  } else {
    writer_->WritePutsSpace(Opcode::Catch_Opcode.GetName());
    writer_->WriteVar(catch_->var, NextChar::Newline);
  }
  writer_->Indent();
  writer_->SetTopLabelType(LabelType::Catch);
  return Result::Ok;
}